

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

void toZigZag(uint16_t *dst,uint16_t *src)

{
  int i;
  uint16_t *src_local;
  uint16_t *dst_local;
  
  for (i = 0; i < 0x40; i = i + 1) {
    dst[i] = src[toZigZag::remap[i]];
  }
  return;
}

Assistant:

static void
toZigZag (uint16_t* dst, uint16_t* src)
{
    static const int remap[] = {
        0,  1,  8,  16, 9,  2,  3,  10, 17, 24, 32, 25, 18, 11, 4,  5,
        12, 19, 26, 33, 40, 48, 41, 34, 27, 20, 13, 6,  7,  14, 21, 28,
        35, 42, 49, 56, 57, 50, 43, 36, 29, 22, 15, 23, 30, 37, 44, 51,
        58, 59, 52, 45, 38, 31, 39, 46, 53, 60, 61, 54, 47, 55, 62, 63};

    for (int i = 0; i < 64; ++i)
        dst[i] = src[remap[i]];
}